

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O3

void __thiscall anon_unknown.dwarf_199c2b::MkdirCommand::~MkdirCommand(MkdirCommand *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_ExternalCommand).super_Command.super_JobDescriptor._vptr_JobDescriptor =
       (_func_int **)&PTR__ExternalCommand_0020c260;
  llvm::SmallVector<llbuild::buildsystem::BuildKey,_1U>::~SmallVector
            (&(this->super_ExternalCommand).missingInputKeys);
  if ((this->super_ExternalCommand).skipValue.Storage.hasVal == true) {
    llbuild::buildsystem::BuildValue::~BuildValue
              ((BuildValue *)&(this->super_ExternalCommand).skipValue);
    (this->super_ExternalCommand).skipValue.Storage.hasVal = false;
  }
  pcVar2 = (this->super_ExternalCommand).description._M_dataplus._M_p;
  paVar1 = &(this->super_ExternalCommand).description.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  llbuild::buildsystem::Command::~Command((Command *)this);
  operator_delete(this,0x138);
  return;
}

Assistant:

virtual void getShortDescription(SmallVectorImpl<char> &result) const override {
    llvm::raw_svector_ostream(result) << getDescription();
  }